

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O1

Contrib_List *
crnlib::Resampler::make_clist
          (int src_x,int dst_x,Boundary_Op boundary_op,_func_Resample_Real_Resample_Real *Pfilter,
          Resample_Real filter_support,Resample_Real filter_scale,Resample_Real src_ofs)

{
  int iVar1;
  Contrib *pCVar2;
  int iVar3;
  Contrib_List *p;
  Contrib_List *pCVar4;
  uint uVar5;
  ulong uVar6;
  Contrib *pCVar7;
  ulong uVar8;
  ulong uVar9;
  Contrib_List *pCVar10;
  Contrib **ppCVar11;
  int iVar12;
  Contrib_List *pCVar13;
  int iVar14;
  Contrib_List *pCVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Resample_Real RVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float local_80;
  float local_7c;
  Contrib *local_40;
  
  p = (Contrib_List *)crnlib_calloc((long)dst_x,0x10,(size_t *)0x0);
  if (p == (Contrib_List *)0x0) {
    return (Contrib_List *)0x0;
  }
  pCVar4 = (Contrib_List *)crnlib_calloc((long)dst_x,0xc,(size_t *)0x0);
  pCVar10 = p;
  pCVar13 = (Contrib_List *)0x0;
  if (pCVar4 == (Contrib_List *)0x0) goto LAB_001450b5;
  fVar22 = 1.0 / filter_scale;
  fVar23 = (float)dst_x / (float)src_x;
  pCVar10 = pCVar4;
  pCVar13 = p;
  if (1.0 <= fVar23) {
    if (dst_x < 1) {
      iVar14 = 0;
    }
    else {
      ppCVar11 = &pCVar4->p;
      uVar9 = 0;
      iVar14 = 0;
      do {
        fVar16 = ((float)(int)uVar9 + 0.5) / fVar23 + -0.5 + src_ofs;
        fVar17 = floorf(fVar16 - filter_support * filter_scale);
        fVar18 = ceilf(filter_support * filter_scale + fVar16);
        *(float *)(ppCVar11 + -1) = fVar16;
        *(int *)((long)ppCVar11 + -4) = (int)fVar17;
        *(int *)ppCVar11 = (int)fVar18;
        iVar14 = (iVar14 - (int)fVar17) + (int)fVar18 + 1;
        uVar9 = uVar9 + 1;
        ppCVar11 = (Contrib **)((long)ppCVar11 + 0xc);
      } while ((uint)dst_x != uVar9);
    }
    if ((iVar14 != 0) &&
       (local_40 = (Contrib *)crnlib_calloc((long)iVar14,8,(size_t *)0x0),
       local_40 != (Contrib *)0x0)) {
      if (0 < dst_x) {
        uVar9 = 0;
        pCVar7 = local_40;
        do {
          fVar23 = *(float *)(&pCVar4->n + uVar9 * 6);
          iVar14 = *(int *)(&pCVar4->field_0x4 + uVar9 * 0xc);
          iVar1 = *(int *)((long)&pCVar4->p + uVar9 * 0xc);
          p[uVar9].n = 0;
          p[uVar9].p = pCVar7;
          fVar16 = 0.0;
          iVar3 = iVar1 - iVar14;
          if (iVar14 <= iVar1) {
            iVar12 = iVar14;
            do {
              RVar20 = (*Pfilter)((fVar23 - (float)iVar12) * fVar22);
              fVar16 = fVar16 + RVar20;
              iVar12 = iVar12 + 1;
            } while (iVar1 + 1 != iVar12);
          }
          pCVar15 = p + uVar9;
          if (iVar1 < iVar14) {
            uVar5 = 0xffffffff;
            local_7c = 0.0;
          }
          else {
            local_7c = 0.0;
            uVar8 = 0xffffffff;
            fVar17 = -1e+20;
            do {
              RVar20 = (*Pfilter)((fVar23 - (float)iVar14) * fVar22);
              fVar18 = RVar20 * (1.0 / fVar16);
              if ((fVar18 != 0.0) || (uVar6 = uVar8, fVar19 = fVar17, NAN(fVar18))) {
                iVar12 = reflect(iVar14,src_x,boundary_op);
                uVar6 = (ulong)pCVar15->n;
                pCVar15->n = pCVar15->n + 1;
                pCVar2 = pCVar15->p;
                pCVar2[uVar6].pixel = (unsigned_short)iVar12;
                pCVar2[uVar6].weight = fVar18;
                local_7c = local_7c + fVar18;
                fVar19 = fVar18;
                if (fVar18 <= fVar17) {
                  uVar6 = uVar8;
                  fVar19 = fVar17;
                }
              }
              iVar14 = iVar14 + 1;
              uVar5 = (uint)uVar6;
              uVar8 = uVar6;
              fVar17 = fVar19;
            } while (iVar1 + 1 != iVar14);
          }
          if ((uVar5 == 0xffffffff) || (pCVar15->n == 0)) goto LAB_0014509b;
          if ((local_7c != 1.0) || (NAN(local_7c))) {
            pCVar15->p[uVar5].weight = (1.0 - local_7c) + pCVar15->p[uVar5].weight;
          }
          pCVar7 = pCVar7 + (iVar3 + 1);
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)dst_x);
      }
      goto LAB_001450b5;
    }
  }
  else {
    if (dst_x < 1) {
      iVar14 = 0;
    }
    else {
      fVar16 = (filter_support / fVar23) * filter_scale;
      ppCVar11 = &pCVar4->p;
      uVar9 = 0;
      iVar14 = 0;
      do {
        fVar17 = ((float)(int)uVar9 + 0.5) / fVar23 + -0.5 + src_ofs;
        fVar18 = floorf(fVar17 - fVar16);
        fVar19 = ceilf(fVar16 + fVar17);
        *(float *)(ppCVar11 + -1) = fVar17;
        *(int *)((long)ppCVar11 + -4) = (int)fVar18;
        *(int *)ppCVar11 = (int)fVar19;
        iVar14 = (iVar14 - (int)fVar18) + (int)fVar19 + 1;
        uVar9 = uVar9 + 1;
        ppCVar11 = (Contrib **)((long)ppCVar11 + 0xc);
      } while ((uint)dst_x != uVar9);
    }
    if ((iVar14 != 0) &&
       (local_40 = (Contrib *)crnlib_calloc((long)iVar14,8,(size_t *)0x0),
       local_40 != (Contrib *)0x0)) {
      if (0 < dst_x) {
        uVar9 = 0;
        pCVar7 = local_40;
        do {
          fVar16 = *(float *)(&pCVar4->n + uVar9 * 6);
          iVar14 = *(int *)(&pCVar4->field_0x4 + uVar9 * 0xc);
          iVar1 = *(int *)((long)&pCVar4->p + uVar9 * 0xc);
          p[uVar9].n = 0;
          p[uVar9].p = pCVar7;
          fVar17 = 0.0;
          iVar3 = iVar1 - iVar14;
          if (iVar14 <= iVar1) {
            iVar12 = iVar14;
            do {
              RVar20 = (*Pfilter)((fVar16 - (float)iVar12) * fVar23 * fVar22);
              fVar17 = fVar17 + RVar20;
              iVar12 = iVar12 + 1;
            } while (iVar1 + 1 != iVar12);
          }
          pCVar15 = p + uVar9;
          if (iVar1 < iVar14) {
            uVar5 = 0xffffffff;
            local_80 = 0.0;
          }
          else {
            local_80 = 0.0;
            uVar8 = 0xffffffff;
            fVar18 = -1e+20;
            do {
              RVar20 = (*Pfilter)((fVar16 - (float)iVar14) * fVar23 * fVar22);
              fVar19 = RVar20 * (1.0 / fVar17);
              if ((fVar19 != 0.0) || (uVar6 = uVar8, fVar21 = fVar18, NAN(fVar19))) {
                iVar12 = reflect(iVar14,src_x,boundary_op);
                uVar6 = (ulong)pCVar15->n;
                pCVar15->n = pCVar15->n + 1;
                pCVar2 = pCVar15->p;
                pCVar2[uVar6].pixel = (unsigned_short)iVar12;
                pCVar2[uVar6].weight = fVar19;
                local_80 = local_80 + fVar19;
                fVar21 = fVar19;
                if (fVar19 <= fVar18) {
                  uVar6 = uVar8;
                  fVar21 = fVar18;
                }
              }
              iVar14 = iVar14 + 1;
              uVar5 = (uint)uVar6;
              uVar8 = uVar6;
              fVar18 = fVar21;
            } while (iVar1 + 1 != iVar14);
          }
          if ((uVar5 == 0xffffffff) || (pCVar15->n == 0)) goto LAB_0014509b;
          if ((local_80 != 1.0) || (NAN(local_80))) {
            pCVar15->p[uVar5].weight = (1.0 - local_80) + pCVar15->p[uVar5].weight;
          }
          pCVar7 = pCVar7 + (iVar3 + 1);
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)dst_x);
      }
      goto LAB_001450b5;
    }
  }
LAB_001450a5:
  crnlib_free(p);
  pCVar13 = (Contrib_List *)0x0;
LAB_001450b5:
  crnlib_free(pCVar10);
  return pCVar13;
LAB_0014509b:
  crnlib_free(local_40);
  goto LAB_001450a5;
}

Assistant:

Resampler::Contrib_List* Resampler::make_clist(
        int src_x, int dst_x, Boundary_Op boundary_op,
        Resample_Real (*Pfilter)(Resample_Real),
        Resample_Real filter_support,
        Resample_Real filter_scale,
        Resample_Real src_ofs)
    {
        typedef struct
        {
            // The center of the range in DISCRETE coordinates (pixel center = 0.0f).
            Resample_Real center;
            int left, right;
        } Contrib_Bounds;

        int i, j, k, n, left, right;
        Resample_Real total_weight;
        Resample_Real xscale, center, half_width, weight;
        Contrib_List* Pcontrib;
        Contrib* Pcpool;
        Contrib* Pcpool_next;
        Contrib_Bounds* Pcontrib_bounds;

        if ((Pcontrib = (Contrib_List*)crnlib_calloc(dst_x, sizeof(Contrib_List))) == nullptr)
        {
            return nullptr;
        }

        Pcontrib_bounds = (Contrib_Bounds*)crnlib_calloc(dst_x, sizeof(Contrib_Bounds));
        if (!Pcontrib_bounds)
        {
            crnlib_free(Pcontrib);
            return (nullptr);
        }

        const Resample_Real oo_filter_scale = 1.0f / filter_scale;

        const Resample_Real NUDGE = 0.5f;
        xscale = dst_x / (Resample_Real)src_x;

        if (xscale < 1.0f)
        {
            int total;
            (void)total;

            /* Handle case when there are fewer destination
         * samples than source samples (downsampling/minification).
         */

            // stretched half width of filter
            half_width = (filter_support / xscale) * filter_scale;

            // Find the range of source sample(s) that will contribute to each destination sample.

            for (i = 0, n = 0; i < dst_x; i++)
            {
                // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
                center = ((Resample_Real)i + NUDGE) / xscale;
                center -= NUDGE;
                center += src_ofs;

                left = cast_to_int((Resample_Real)floor(center - half_width));
                right = cast_to_int((Resample_Real)ceil(center + half_width));

                Pcontrib_bounds[i].center = center;
                Pcontrib_bounds[i].left = left;
                Pcontrib_bounds[i].right = right;

                n += (right - left + 1);
            }

            /* Allocate memory for contributors. */

            if ((n == 0) || ((Pcpool = (Contrib*)crnlib_calloc(n, sizeof(Contrib))) == nullptr))
            {
                crnlib_free(Pcontrib);
                crnlib_free(Pcontrib_bounds);
                return nullptr;
            }
            total = n;

            Pcpool_next = Pcpool;

            /* Create the list of source samples which
         * contribute to each destination sample.
         */

            for (i = 0; i < dst_x; i++)
            {
                int max_k = -1;
                Resample_Real max_w = -1e+20f;

                center = Pcontrib_bounds[i].center;
                left = Pcontrib_bounds[i].left;
                right = Pcontrib_bounds[i].right;

                Pcontrib[i].n = 0;
                Pcontrib[i].p = Pcpool_next;
                Pcpool_next += (right - left + 1);
                resampler_assert((Pcpool_next - Pcpool) <= total);

                total_weight = 0;

                for (j = left; j <= right; j++)
                {
                    total_weight += (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale);
                }
                const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

                total_weight = 0;

#if RESAMPLER_DEBUG
                printf("%i: ", i);
#endif

                for (j = left; j <= right; j++)
                {
                    weight = (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale) * norm;
                    if (weight == 0.0f)
                    {
                        continue;
                    }

                    n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
                    printf("%i(%f), ", n, weight);
#endif

                    /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

                    k = Pcontrib[i].n++;

                    Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
                    Pcontrib[i].p[k].weight = weight; /* store src sample weight */

                    total_weight += weight; /* total weight of all contributors */

                    if (weight > max_w)
                    {
                        max_w = weight;
                        max_k = k;
                    }
                }

#if RESAMPLER_DEBUG
                printf("\n\n");
#endif

                //resampler_assert(Pcontrib[i].n);
                //resampler_assert(max_k != -1);
                if ((max_k == -1) || (Pcontrib[i].n == 0))
                {
                    crnlib_free(Pcpool);
                    crnlib_free(Pcontrib);
                    crnlib_free(Pcontrib_bounds);
                    return nullptr;
                }

                if (total_weight != 1.0f)
                {
                    Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
                }
            }
        }
        else
        {
            /* Handle case when there are more
         * destination samples than source
         * samples (upsampling).
         */

            half_width = filter_support * filter_scale;

            // Find the source sample(s) that contribute to each destination sample.

            for (i = 0, n = 0; i < dst_x; i++)
            {
                // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
                center = ((Resample_Real)i + NUDGE) / xscale;
                center -= NUDGE;
                center += src_ofs;

                left = cast_to_int((Resample_Real)floor(center - half_width));
                right = cast_to_int((Resample_Real)ceil(center + half_width));

                Pcontrib_bounds[i].center = center;
                Pcontrib_bounds[i].left = left;
                Pcontrib_bounds[i].right = right;

                n += (right - left + 1);
            }

            /* Allocate memory for contributors. */

            int total = n;
            if ((total == 0) || ((Pcpool = (Contrib*)crnlib_calloc(total, sizeof(Contrib))) == nullptr))
            {
                crnlib_free(Pcontrib);
                crnlib_free(Pcontrib_bounds);
                return nullptr;
            }

            Pcpool_next = Pcpool;

            /* Create the list of source samples which
         * contribute to each destination sample.
         */

            for (i = 0; i < dst_x; i++)
            {
                int max_k = -1;
                Resample_Real max_w = -1e+20f;

                center = Pcontrib_bounds[i].center;
                left = Pcontrib_bounds[i].left;
                right = Pcontrib_bounds[i].right;

                Pcontrib[i].n = 0;
                Pcontrib[i].p = Pcpool_next;
                Pcpool_next += (right - left + 1);
                resampler_assert((Pcpool_next - Pcpool) <= total);

                total_weight = 0;
                for (j = left; j <= right; j++)
                {
                    total_weight += (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale);
                }

                const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

                total_weight = 0;

#if RESAMPLER_DEBUG
                printf("%i: ", i);
#endif

                for (j = left; j <= right; j++)
                {
                    weight = (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale) * norm;
                    if (weight == 0.0f)
                    {
                        continue;
                    }

                    n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
                    printf("%i(%f), ", n, weight);
#endif

                    /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

                    k = Pcontrib[i].n++;

                    Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
                    Pcontrib[i].p[k].weight = weight; /* store src sample weight */

                    total_weight += weight; /* total weight of all contributors */

                    if (weight > max_w)
                    {
                        max_w = weight;
                        max_k = k;
                    }
                }

#if RESAMPLER_DEBUG
                printf("\n\n");
#endif

                //resampler_assert(Pcontrib[i].n);
                //resampler_assert(max_k != -1);

                if ((max_k == -1) || (Pcontrib[i].n == 0))
                {
                    crnlib_free(Pcpool);
                    crnlib_free(Pcontrib);
                    crnlib_free(Pcontrib_bounds);
                    return nullptr;
                }

                if (total_weight != 1.0f)
                {
                    Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
                }
            }
        }

#if RESAMPLER_DEBUG
        printf("*******\n");
#endif

        crnlib_free(Pcontrib_bounds);

        return Pcontrib;
    }